

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_close_element(lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *name,
                          size_t name_len,ly_bool empty)

{
  uint32_t uVar1;
  lyd_node *plVar2;
  lyd_node_inner *plVar3;
  ly_ctx *ctx;
  int iVar4;
  char cVar5;
  char *pcVar6;
  ly_in *in;
  char *pcVar7;
  lyd_node *plVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  
  uVar1 = (xmlctx->elements).count;
  if (uVar1 == 0) {
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",
            name_len & 0xffffffff,name);
  }
  else {
    uVar10 = uVar1 - 1;
    plVar2 = (xmlctx->elements).field_2.dnodes[uVar10];
    plVar3 = plVar2->parent;
    plVar8 = plVar2->next;
    if ((plVar2->next == (lyd_node *)name_len && plVar3 == (lyd_node_inner *)prefix_len) &&
       (((plVar8 = (lyd_node *)name_len, prefix_len == 0 ||
         (iVar4 = strncmp(prefix,*(char **)plVar2,prefix_len), iVar4 == 0)) &&
        (iVar4 = strncmp(name,(char *)plVar2->schema,name_len), iVar4 == 0)))) {
      ly_set_rm_index(&xmlctx->elements,uVar10,free);
      lyxml_ns_rm(xmlctx);
      do {
        in = xmlctx->in;
        pcVar7 = in->current;
        cVar5 = *pcVar7;
        if (((cVar5 != '\t') && (cVar5 != ' ')) && (cVar5 != '\r')) {
          if (cVar5 != '\n') {
            if ((empty != '\0') && (cVar5 == '/')) {
              ly_in_skip(in,1);
              in = xmlctx->in;
              pcVar7 = in->current;
              cVar5 = *pcVar7;
              if (cVar5 == '\0') {
                ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
                return LY_EVALID;
              }
            }
            if (cVar5 != '>') {
              ctx = xmlctx->ctx;
              uVar10 = LY_VCODE_INSTREXP_len(pcVar7);
              ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,
                      "Invalid character sequence \"%.*s\", expected %s.",(ulong)uVar10,
                      xmlctx->in->current,"element tag termination (\'>\')");
              return LY_EVALID;
            }
            ly_in_skip(in,1);
            return LY_SUCCESS;
          }
          in->line = in->line + 1;
        }
        ly_in_skip(in,1);
      } while( true );
    }
    pcVar7 = *(char **)plVar2;
    bVar11 = pcVar7 == (char *)0x0;
    if (bVar11) {
      pcVar7 = "";
    }
    pcVar6 = ":";
    pcVar9 = ":";
    if (bVar11) {
      pcVar9 = "";
    }
    if (prefix == (char *)0x0) {
      prefix = "";
      pcVar6 = "";
    }
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
            "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",plVar3,
            pcVar7,pcVar9,plVar8,plVar2->schema,prefix_len,prefix,pcVar6,name_len,name);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_close_element(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len, const char *name, size_t name_len,
        ly_bool empty)
{
    struct lyxml_elem *e;

    /* match opening and closing element tags */
    if (!xmlctx->elements.count) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").",
                (int)name_len, name);
        return LY_EVALID;
    }

    e = (struct lyxml_elem *)xmlctx->elements.objs[xmlctx->elements.count - 1];
    if ((e->prefix_len != prefix_len) || (e->name_len != name_len) ||
            (prefix_len && strncmp(prefix, e->prefix, e->prefix_len)) || strncmp(name, e->name, e->name_len)) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",
                (int)e->prefix_len, e->prefix ? e->prefix : "", e->prefix ? ":" : "", (int)e->name_len, e->name,
                (int)prefix_len, prefix ? prefix : "", prefix ? ":" : "", (int)name_len, name);
        return LY_EVALID;
    }

    /* opening and closing element tags matches, remove record from the opening tags list */
    ly_set_rm_index(&xmlctx->elements, xmlctx->elements.count - 1, free);

    /* remove also the namespaces connected with the element */
    lyxml_ns_rm(xmlctx);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* special "<elem/>" element */
    if (empty && (xmlctx->in->current[0] == '/')) {
        move_input(xmlctx, 1);
    }

    /* parse closing tag */
    if (xmlctx->in->current[0] != '>') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "element tag termination ('>')");
        return LY_EVALID;
    }

    /* move after closing tag without checking for EOF */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}